

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::Group::Match(Group *this,EitherFlag *flag)

{
  bool bVar1;
  int iVar2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_00;
  reference ppBVar3;
  undefined4 extraout_var;
  FlagBase *match;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  EitherFlag *flag_local;
  Group *this_local;
  
  this_00 = Children(this);
  __end2 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_00);
  child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                *)&child);
    if (!bVar1) {
      return (FlagBase *)0x0;
    }
    ppBVar3 = __gnu_cxx::
              __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&__end2);
    iVar2 = (*(*ppBVar3)->_vptr_Base[7])(*ppBVar3,flag);
    if ((FlagBase *)CONCAT44(extraout_var,iVar2) != (FlagBase *)0x0) break;
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&__end2);
  }
  return (FlagBase *)CONCAT44(extraout_var,iVar2);
}

Assistant:

virtual FlagBase *Match(const EitherFlag &flag) override
            {
                for (Base *child: Children())
                {
                    if (FlagBase *match = child->Match(flag))
                    {
                        return match;
                    }
                }
                return nullptr;
            }